

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc.cpp
# Opt level: O3

void __thiscall
NfcFilter::process2(NfcFilter *this,span<const_float,_18446744073709551615UL> src,float *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pfVar6 = src.mData;
  fVar7 = (this->second).z[0];
  fVar8 = (this->second).z[1];
  if (pfVar6 != src.mDataEnd) {
    fVar1 = (this->second).gain;
    fVar2 = (this->second).b1;
    fVar3 = (this->second).b2;
    fVar4 = (this->second).a1;
    fVar5 = (this->second).a2;
    do {
      fVar9 = -fVar5 * fVar8 + *pfVar6 * fVar1 + fVar7 * -fVar4;
      fVar10 = fVar2 * fVar7;
      fVar11 = fVar3 * fVar8;
      fVar8 = fVar8 + fVar7;
      fVar7 = fVar7 + fVar9;
      *dst = fVar11 + fVar10 + fVar9;
      pfVar6 = pfVar6 + 1;
      dst = dst + 1;
    } while (pfVar6 != src.mDataEnd);
  }
  (this->second).z[0] = fVar7;
  (this->second).z[1] = fVar8;
  return;
}

Assistant:

void NfcFilter::process2(const al::span<const float> src, float *RESTRICT dst)
{
    const float gain{second.gain};
    const float b1{second.b1};
    const float b2{second.b2};
    const float a1{second.a1};
    const float a2{second.a2};
    float z1{second.z[0]};
    float z2{second.z[1]};
    auto proc_sample = [gain,b1,b2,a1,a2,&z1,&z2](const float in) noexcept -> float
    {
        const float y{in*gain - a1*z1 - a2*z2};
        const float out{y + b1*z1 + b2*z2};
        z2 += z1;
        z1 += y;
        return out;
    };
    std::transform(src.cbegin(), src.cend(), dst, proc_sample);
    second.z[0] = z1;
    second.z[1] = z2;
}